

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void des_cbc_encrypt(ssh_cipher *ciph,void *vdata,int len)

{
  LR LVar1;
  
  for (; 0 < len; len = len + -8) {
    LVar1 = des_load_lr(vdata);
    LVar1 = des_full_cipher((LR)((ulong)LVar1 ^ (ulong)ciph[-1].vt),(des_keysched *)(ciph + -0x11),0
                            ,1);
    des_store_lr(vdata,LVar1);
    *(LR *)(ciph + -1) = LVar1;
    vdata = (void *)((long)vdata + 8);
  }
  return;
}

Assistant:

static void des_cbc_encrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des_cbc_ctx *ctx = container_of(ciph, struct des_cbc_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR plaintext = des_load_lr(data);
        LR cipher_in = des_xor_lr(plaintext, ctx->iv);
        LR ciphertext = des_full_cipher(cipher_in, &ctx->sched, ENCIPHER);
        des_store_lr(data, ciphertext);
        ctx->iv = ciphertext;
    }
}